

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::LookupNearest(Image *this,Point2f p,WrapMode2D wrapMode)

{
  Point2f p_00;
  int iVar1;
  WrapMode2D in_RDX;
  size_t in_RSI;
  Image *in_RDI;
  Float FVar2;
  undefined1 in_ZMM0 [64];
  int c;
  ImageChannelValues *cv;
  reference in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  Image *this_00;
  undefined4 local_28;
  
  p_00.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = in_RDI;
  NChannels((Image *)0x4c3baa);
  ImageChannelValues::ImageChannelValues
            ((ImageChannelValues *)this_00,in_RSI,(Float)((ulong)in_RDI >> 0x20));
  for (local_28 = 0; iVar1 = NChannels((Image *)0x4c3bd5), local_28 < iVar1; local_28 = local_28 + 1
      ) {
    FVar2 = LookupNearestChannel(this_00,p_00,(int)(in_RSI >> 0x20),in_RDX);
    in_stack_ffffffffffffff88 =
         InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                    CONCAT44(FVar2,in_stack_ffffffffffffff90),(size_type)in_stack_ffffffffffffff88);
    *in_stack_ffffffffffffff88 = FVar2;
  }
  return (ImageChannelValues *)in_RDI;
}

Assistant:

ImageChannelValues Image::LookupNearest(Point2f p, WrapMode2D wrapMode) const {
    ImageChannelValues cv(NChannels(), Float(0));
    for (int c = 0; c < NChannels(); ++c)
        cv[c] = LookupNearestChannel(p, c, wrapMode);
    return cv;
}